

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.cpp
# Opt level: O1

UStringTrieResult __thiscall icu_63::BytesTrie::current(BytesTrie *this)

{
  UStringTrieResult UVar1;
  
  if (this->pos_ == (byte *)0x0) {
    return USTRINGTRIE_NO_MATCH;
  }
  if ((this->remainingMatchLength_ < 0) && (UVar1 = (UStringTrieResult)*this->pos_, 0x1f < UVar1)) {
    return UVar1 & USTRINGTRIE_NO_VALUE ^ USTRINGTRIE_INTERMEDIATE_VALUE;
  }
  return USTRINGTRIE_NO_VALUE;
}

Assistant:

UStringTrieResult
BytesTrie::current() const {
    const uint8_t *pos=pos_;
    if(pos==NULL) {
        return USTRINGTRIE_NO_MATCH;
    } else {
        int32_t node;
        return (remainingMatchLength_<0 && (node=*pos)>=kMinValueLead) ?
                valueResult(node) : USTRINGTRIE_NO_VALUE;
    }
}